

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.cpp
# Opt level: O1

optional<Array2D<unsigned_int>_> * __thiscall
WFC::run(optional<Array2D<unsigned_int>_> *__return_storage_ptr__,WFC *this)

{
  ObserveStatus OVar1;
  Array2D<unsigned_int> local_48;
  
  while( true ) {
    OVar1 = observe(this);
    if (OVar1 == success) {
      wave_to_output(&local_48,this);
      (__return_storage_ptr__->super__Optional_base<Array2D<unsigned_int>,_false,_false>)._M_payload
      .super__Optional_payload<Array2D<unsigned_int>,_true,_false,_false>.
      super__Optional_payload_base<Array2D<unsigned_int>_>._M_payload._M_value.height =
           local_48.height;
      (__return_storage_ptr__->super__Optional_base<Array2D<unsigned_int>,_false,_false>)._M_payload
      .super__Optional_payload<Array2D<unsigned_int>,_true,_false,_false>.
      super__Optional_payload_base<Array2D<unsigned_int>_>._M_payload._M_value.width =
           local_48.width;
      *(pointer *)
       &(__return_storage_ptr__->super__Optional_base<Array2D<unsigned_int>,_false,_false>).
        _M_payload.super__Optional_payload<Array2D<unsigned_int>,_true,_false,_false>.
        super__Optional_payload_base<Array2D<unsigned_int>_>._M_payload._M_value.data.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl =
           local_48.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->super__Optional_base<Array2D<unsigned_int>,_false,_false>).
               _M_payload.super__Optional_payload<Array2D<unsigned_int>,_true,_false,_false>.
               super__Optional_payload_base<Array2D<unsigned_int>_>._M_payload._M_value.data.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8) =
           local_48.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->super__Optional_base<Array2D<unsigned_int>,_false,_false>).
               _M_payload.super__Optional_payload<Array2D<unsigned_int>,_true,_false,_false>.
               super__Optional_payload_base<Array2D<unsigned_int>_>._M_payload._M_value.data.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 0x10) =
           local_48.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->super__Optional_base<Array2D<unsigned_int>,_false,_false>)._M_payload
      .super__Optional_payload<Array2D<unsigned_int>,_true,_false,_false>.
      super__Optional_payload_base<Array2D<unsigned_int>_>._M_engaged = true;
      return __return_storage_ptr__;
    }
    if (OVar1 == failure) break;
    Propagator::propagate(&this->propagator,&this->wave);
  }
  (__return_storage_ptr__->super__Optional_base<Array2D<unsigned_int>,_false,_false>)._M_payload.
  super__Optional_payload<Array2D<unsigned_int>,_true,_false,_false>.
  super__Optional_payload_base<Array2D<unsigned_int>_>._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<Array2D<unsigned>> WFC::run() noexcept {
  while (true) {

    // Define the value of an undefined cell.
    ObserveStatus result = observe();

    // Check if the algorithm has terminated.
    if (result == failure) {
      return std::nullopt;
    } else if (result == success) {
      return wave_to_output();
    }

    // Propagate the information.
    propagator.propagate(wave);
  }
}